

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lanli.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 uVar4;
  clock_t cVar5;
  clock_t cVar6;
  ulong uVar7;
  size_t __n;
  char *pcVar8;
  undefined *puVar9;
  uint uVar10;
  char *string;
  void *__ptr;
  int iVar11;
  int iVar12;
  long lVar13;
  char cVar14;
  bool bVar15;
  double dVar16;
  size_t local_a0;
  char **local_98;
  ulong local_90;
  char *local_88;
  option_data local_80;
  FILE *local_38;
  
  local_38 = _stdin;
  local_80.basename = *argv;
  local_80.done = 0;
  local_80.show_time = 0;
  local_80.iunit = 0x400;
  local_80.ounit = 0x40;
  local_80.filename = (char *)0x0;
  local_80.callback = CALLBACK_STRICT_POST;
  local_80.flags = LANLI_FLAG_COMMENTS_SKIP|LANLI_FLAG_COMMENTS_PARSE;
  local_80.levels = 0;
  local_80.max_nesting = 0x10;
  local_80.max_attributes = 8;
  iVar12 = 1;
  uVar7 = 0;
  iVar11 = iVar12;
  if (1 < argc) {
    local_98 = argv;
    uVar7 = 0;
LAB_001023e1:
    do {
      local_90 = uVar7;
      pcVar8 = argv[iVar12];
      if ((*pcVar8 == '-') && (cVar14 = pcVar8[1], cVar14 != '\0')) {
        iVar11 = iVar12 + 1;
        if (iVar11 < argc) {
          string = argv[iVar11];
        }
        else {
          string = (char *)0x0;
        }
        if (cVar14 == '-') {
          uVar7 = local_90;
          argv = local_98;
          if (pcVar8[2] == '\0') break;
          if (string == (char *)0x0) {
            bVar15 = false;
          }
          else {
            iVar11 = parseint(string,(long *)&local_a0);
            bVar15 = iVar11 != 0;
          }
          pcVar8 = pcVar8 + 2;
          iVar11 = strcmp(pcVar8,"help");
          if (iVar11 == 0) {
LAB_0010274d:
            print_help(local_80.basename);
          }
          else {
            iVar11 = strcmp(pcVar8,"version");
            if (iVar11 != 0) {
              iVar11 = strcmp(pcVar8,"time");
              if (iVar11 == 0) {
                local_80.show_time = 1;
                iVar11 = 1;
                argv = local_98;
              }
              else {
                iVar11 = strcmp(pcVar8,"levels");
                if ((bool)(iVar11 == 0 & bVar15)) {
                  local_80.levels = local_a0;
                }
                else {
                  iVar11 = strcmp(pcVar8,"max-nesting");
                  if ((bool)(iVar11 == 0 & bVar15)) {
                    local_80.max_nesting = local_a0;
                  }
                  else {
                    iVar11 = strcmp(pcVar8,"max-attributes");
                    if ((bool)(iVar11 == 0 & bVar15)) {
                      local_80.max_attributes = local_a0;
                    }
                    else {
                      iVar11 = strcmp(pcVar8,"input-unit");
                      if ((bool)(iVar11 == 0 & bVar15)) {
                        local_80.iunit = local_a0;
                      }
                      else {
                        iVar11 = strcmp(pcVar8,"output-unit");
                        argv = local_98;
                        if (!(bool)(iVar11 == 0 & bVar15)) {
                          lVar13 = 8;
                          do {
                            iVar11 = strcmp(pcVar8,*(char **)((long)&callbacks_info[0].callback +
                                                             lVar13));
                            if (iVar11 == 0) {
                              local_80.callback =
                                   *(undefined4 *)
                                    ((long)&__do_global_dtors_aux_fini_array_entry + lVar13);
                              iVar11 = 1;
                              goto LAB_0010256c;
                            }
                            lVar13 = lVar13 + 0x18;
                          } while (lVar13 != 0x98);
                          iVar1 = parse_flag_option(pcVar8,&local_80);
                          iVar11 = 1;
                          if ((iVar1 != 0) ||
                             (iVar1 = parse_negative_option(pcVar8,&local_80), iVar1 != 0))
                          goto LAB_0010256c;
                          fprintf(_stderr,"Wrong option \'--%s\' found.\n",pcVar8);
                          goto LAB_0010276d;
                        }
                        local_80.ounit = local_a0;
                      }
                    }
                  }
                }
                iVar11 = 2;
                argv = local_98;
              }
LAB_0010256c:
              iVar12 = iVar11 + iVar12;
              uVar7 = local_90;
              iVar11 = iVar12;
              if (argc <= iVar12) break;
              goto LAB_001023e1;
            }
LAB_00102759:
            puts("Built with Lanli 0.0.1.");
          }
          local_80.done = 1;
          local_80.show_time = 0;
          goto LAB_0010276d;
        }
        pcVar8 = pcVar8 + 2;
        iVar12 = local_80.show_time;
        do {
          local_88 = string;
          if (*pcVar8 != '\0') {
            local_88 = pcVar8;
          }
          if (local_88 == (char *)0x0) {
            bVar15 = false;
          }
          else {
            iVar1 = parseint(local_88,(long *)&local_a0);
            bVar15 = iVar1 != 0;
          }
          argv = local_98;
          uVar7 = local_90;
          if (cVar14 != 'T') {
            if (cVar14 == 'v') goto LAB_00102759;
            if (cVar14 == 'h') goto LAB_0010274d;
            local_80.show_time = iVar12;
            if ((bool)(cVar14 == 'l' & bVar15)) {
              local_80.levels = local_a0;
            }
            else if ((bool)(cVar14 == 'n' & bVar15)) {
              local_80.max_nesting = local_a0;
            }
            else if ((bool)(cVar14 == 'a' & bVar15)) {
              local_80.max_attributes = local_a0;
            }
            else if ((bool)(cVar14 == 'i' & bVar15)) {
              local_80.iunit = local_a0;
            }
            else {
              if (!(bool)(cVar14 == 'o' & bVar15)) {
                main_cold_1();
                goto LAB_0010276d;
              }
              local_80.ounit = local_a0;
            }
            iVar12 = iVar11 + (uint)(local_88 == string);
            goto LAB_00102620;
          }
          cVar14 = *pcVar8;
          pcVar8 = pcVar8 + 1;
          iVar12 = 1;
        } while (cVar14 != '\0');
        local_80.show_time = 1;
        iVar12 = iVar11;
      }
      else {
        iVar1 = (int)local_90;
        iVar11 = parse_argument(iVar1,pcVar8,0,&local_80);
        if (iVar11 == 0) goto LAB_0010276d;
        uVar7 = (ulong)(iVar1 + 1);
        iVar12 = iVar12 + 1;
      }
LAB_00102620:
      iVar11 = iVar12;
    } while (iVar12 < argc);
  }
  if (iVar11 < argc) {
    lVar13 = 0;
    do {
      iVar12 = parse_argument((int)uVar7 + (int)lVar13,argv[iVar11 + lVar13],1,&local_80);
      if (iVar12 == 0) {
LAB_0010276d:
        return (uint)(local_80.done == 0);
      }
      lVar13 = lVar13 + 1;
    } while (argc - iVar11 != (int)lVar13);
  }
  if (local_80.done == 0) {
    __stream = local_38;
    if ((local_80.filename == (char *)0x0) ||
       (__stream = fopen(local_80.filename,"r"), __stream != (FILE *)0x0)) {
      puVar2 = (undefined8 *)lanli_buffer_new(local_80.iunit);
      iVar11 = lanli_buffer_putf(puVar2,__stream);
      if (iVar11 == 0) {
        if (__stream != _stdin) {
          fclose(__stream);
        }
        if ((local_80._40_8_ & 0xffffffff) < 6) {
          puVar9 = (&PTR_lanli_callback_strict_post_00104d90)[local_80._40_8_ & 0xffffffff];
        }
        else {
          puVar9 = (undefined *)0x0;
        }
        plVar3 = (long *)lanli_buffer_new(local_80.ounit);
        uVar4 = lanli_document_new(puVar9,0,local_80.flags,local_80.levels,local_80.max_nesting,
                                   local_80.max_attributes);
        cVar5 = clock();
        lanli_document_render(uVar4,plVar3,*puVar2,puVar2[1]);
        cVar6 = clock();
        lanli_buffer_free(puVar2);
        lanli_document_free(uVar4);
        __ptr = (void *)*plVar3;
        __n = plVar3[1];
        if (__n == 0) {
          __n = 0;
        }
        else if (*(char *)((long)__ptr + (__n - 1)) != '\n') {
          lanli_buffer_putc(plVar3,10);
          __ptr = (void *)*plVar3;
          __n = plVar3[1];
        }
        fwrite(__ptr,1,__n,_stdout);
        lanli_buffer_free(plVar3);
        iVar11 = ferror(_stdout);
        if (iVar11 == 0) {
          if (local_80.show_time == 0) {
            return 0;
          }
          if (cVar6 == -1 || cVar5 == -1) {
            main_cold_5();
            return 1;
          }
          dVar16 = (double)(cVar6 - cVar5) / 1000000.0;
          if (1.0 <= dVar16) {
            pcVar8 = "Time spent on rendering: %6.3f s.\n";
          }
          else {
            dVar16 = dVar16 * 1000.0;
            pcVar8 = "Time spent on rendering: %7.2f ms.\n";
          }
          fprintf(_stderr,pcVar8,dVar16);
          return 0;
        }
        main_cold_4();
      }
      else {
        main_cold_3();
      }
    }
    else {
      main_cold_2();
    }
    uVar10 = 5;
  }
  else {
    uVar10 = (uint)(local_80.done == 0);
  }
  return uVar10;
}

Assistant:

int main(int argc, char **argv) {
  struct option_data data;
  clock_t t1, t2;
  FILE *file = stdin;
  lanli_buffer *ib, *ob;
  lanli_callback callback = NULL;
  void *opaque = NULL;
  lanli_document *document;

  /* Parse options */
  data.basename = argv[0];
  data.done = 0;
  data.show_time = 0;
  data.iunit = DEF_IUNIT;
  data.ounit = DEF_OUNIT;
  data.filename = NULL;
  data.callback = DEF_CALLBACK;
  data.flags = DEF_FLAGS;
  data.levels = DEF_LEVELS;
  data.max_nesting = DEF_MAX_NESTING;
  data.max_attributes = DEF_MAX_ATTRIBUTES;

  argc = parse_options(argc, argv, parse_short_option, parse_long_option, parse_argument, &data);
  if (data.done) return 0;
  if (!argc) return 1;

  /* Open input file, if needed */
  if (data.filename) {
    file = fopen(data.filename, "r");
    if (!file) {
      fprintf(stderr, "Unable to open input file \"%s\": %s\n", data.filename, strerror(errno));
      return 5;
    }
  }

  /* Read everything */
  ib = lanli_buffer_new(data.iunit);

  if (lanli_buffer_putf(ib, file)) {
    fprintf(stderr, "I/O errors found while reading input.\n");
    return 5;
  }

  if (file != stdin) fclose(file);

  /* Obtain the callback */
  switch (data.callback) {
    case CALLBACK_STRICT_POST:
      callback = lanli_callback_strict_post;
      break;
    case CALLBACK_ACCEPT:
      callback = callback_accept;
      break;
    case CALLBACK_ESCAPE:
      callback = callback_escape;
      break;
    case CALLBACK_SKIP:
      callback = callback_skip;
      break;
    case CALLBACK_IGNORE:
      callback = callback_ignore;
      break;
    case CALLBACK_VERBATIM:
      callback = callback_verbatim;
      break;
  };

  /* Sanitize input HTML */
  ob = lanli_buffer_new(data.ounit);
  document = lanli_document_new(callback, opaque, data.flags, data.levels, data.max_nesting, data.max_attributes);

  t1 = clock();
  lanli_document_render(document, ob, ib->data, ib->size);
  t2 = clock();

  /* Cleanup */
  lanli_buffer_free(ib);
  lanli_document_free(document);

  /* Write the result to stdout */
  if (ob->size && ob->data[ob->size-1] != '\n')
    lanli_buffer_putc(ob, '\n');

  (void)fwrite(ob->data, 1, ob->size, stdout);
  lanli_buffer_free(ob);

  if (ferror(stdout)) {
    fprintf(stderr, "I/O errors found while writing output.\n");
    return 5;
  }

  /* Show rendering time */
  if (data.show_time) {
    if (t1 == -1 || t2 == -1) {
      fprintf(stderr, "Failed to get the time.\n");
      return 1;
    }

    double elapsed = (double)(t2 - t1) / CLOCKS_PER_SEC;
    if (elapsed < 1)
      fprintf(stderr, "Time spent on rendering: %7.2f ms.\n", elapsed*1e3);
    else
      fprintf(stderr, "Time spent on rendering: %6.3f s.\n", elapsed);
  }

  return 0;
}